

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

void pbrt::Triangle::Init(Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
  allMeshes = (undefined8 *)CONCAT44(extraout_var,iVar1);
  *allMeshes = alloc.memoryResource;
  allMeshes[1] = 0;
  allMeshes[2] = 0;
  allMeshes[3] = 0;
  return;
}

Assistant:

void Triangle::Init(Allocator alloc) {
    allMeshes = alloc.new_object<pstd::vector<const TriangleMesh *>>(alloc);
#if defined(PBRT_BUILD_GPU_RENDERER)
    if (Options->useGPU)
        CUDA_CHECK(
            cudaMemcpyToSymbol(allTriangleMeshesGPU, &allMeshes, sizeof(allMeshes)));
#endif
}